

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

string * phosg::escape_controls(string *__return_storage_ptr__,string *s,bool escape_non_ascii)

{
  byte __c;
  char *__s;
  ulong uVar1;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (s->_M_string_length != 0) {
    uVar1 = 0;
    do {
      __c = (s->_M_dataplus)._M_p[uVar1];
      if (0x21 < __c) {
        if (__c == 0x5c) {
          __s = "\\\\";
        }
        else {
          __s = "\\\'";
          if (__c != 0x27) {
            if (__c != 0x22) goto switchD_00109557_default;
            __s = "\\\"";
          }
        }
        goto LAB_001095d3;
      }
      switch(__c) {
      case 7:
        __s = "\\a";
        break;
      case 8:
        __s = "\\b";
        break;
      case 9:
        __s = "\\t";
        break;
      case 10:
        __s = "\\n";
        break;
      case 0xb:
        __s = "\\v";
        break;
      case 0xc:
        __s = "\\f";
        break;
      case 0xd:
        __s = "\\r";
        break;
      default:
switchD_00109557_default:
        if (escape_non_ascii) {
          if ((byte)(__c + 0x81) < 0xa1) goto LAB_001095fc;
LAB_00109589:
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(__return_storage_ptr__,__c);
        }
        else {
          if (0xa0 < (byte)(__c + 0x81) || (char)__c < '\0') goto LAB_00109589;
LAB_001095fc:
          string_printf_abi_cxx11_(&local_50,"\\x%02X");
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append(__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        goto LAB_001095db;
      }
LAB_001095d3:
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,__s);
LAB_001095db:
      uVar1 = uVar1 + 1;
    } while (uVar1 < s->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string escape_controls(const string& s, bool escape_non_ascii) {
  string ret;
  for (size_t x = 0; x < s.size(); x++) {
    char ch = s[x];
    if (ch == '\"') {
      ret += "\\\"";
    } else if (ch == '\'') {
      ret += "\\\'";
    } else if (ch == '\\') {
      ret += "\\\\";
    } else if (ch == '\t') {
      ret += "\\t";
    } else if (ch == '\r') {
      ret += "\\r";
    } else if (ch == '\n') {
      ret += "\\n";
    } else if (ch == '\f') {
      ret += "\\f";
    } else if (ch == '\b') {
      ret += "\\b";
    } else if (ch == '\a') {
      ret += "\\a";
    } else if (ch == '\v') {
      ret += "\\v";
    } else if (escape_non_ascii ? (ch < 0x20 || ch > 0x7E) : (!(ch & 0x80) && ((ch < 0x20) || ch == 0x7F))) {
      ret += string_printf("\\x%02X", static_cast<uint8_t>(ch));
    } else {
      ret += ch;
    }
  }
  return ret;
}